

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ED.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pmVar10;
  pointer pmVar11;
  int iVar12;
  int iVar13;
  ostream *poVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long *plVar18;
  ulong uVar19;
  char *pcVar20;
  int in_R8D;
  EDCircles *pEVar21;
  ulong uVar22;
  __m128d t;
  Ptr<cv::ximgproc::EdgeDrawing> ed;
  Scalar color_1;
  vector<cv::Vec<float,_4>,_std::allocator<cv::Vec<float,_4>_>_> lines;
  vector<cv::Vec<double,_6>,_std::allocator<cv::Vec<double,_6>_>_> ellipses;
  EDCircles colorCircle;
  Mat diff;
  Mat lineImg0;
  Mat ellipsImg0;
  EDCircles testEDCircles;
  Mat lineImg1;
  Mat edgeImg0;
  Mat ellipsImg1;
  EDLines colorLine;
  Mat colorImg;
  Mat testImg;
  Mat edgeImg1;
  EDColor testEDColor;
  Mat gradImg;
  Mat anchImg;
  EDLines testEDLines;
  EDPF testEDPF;
  ED testED;
  _InputArray local_1fb8;
  long *local_1fa0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f98;
  int local_1f8c;
  vector<mEllipse,_std::allocator<mEllipse>_> local_1f88;
  vector<mCircle,_std::allocator<mCircle>_> local_1f68;
  pointer local_1f48;
  pointer pmStack_1f40;
  Size local_1f38;
  undefined8 uStack_1f30;
  void *local_1ee8;
  void *pvStack_1ee0;
  undefined8 local_1ed8;
  mCircle local_1ec8;
  Mat *local_1ea8;
  Mat *local_1ea0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_1e98;
  Mat *local_1e90;
  void *local_1e88;
  undefined8 uStack_1e80;
  undefined8 local_1e78;
  Mat *local_1e70;
  Mat *local_1e68;
  Mat *local_1e60;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_1e58;
  undefined8 *local_1e50;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_1e48;
  int local_1e40;
  int local_1e3c;
  int local_1e38;
  int local_1e34;
  int local_1e30;
  int local_1e2c;
  int local_1e28;
  int local_1e24;
  int local_1e20;
  int local_1e1c;
  int local_1e18;
  int local_1e14;
  Mat *local_1e10;
  Mat *local_1e08;
  Mat *local_1e00;
  uchar **local_1df8;
  uchar **local_1df0;
  Mat *local_1de8;
  Mat *local_1de0;
  Mat *local_1dd8;
  Mat *local_1dd0;
  Mat *local_1dc8;
  Mat *local_1dc0;
  undefined8 local_1db8;
  undefined8 local_1db0;
  undefined8 local_1da8;
  undefined8 local_1da0;
  undefined8 local_1d98;
  undefined8 local_1d90;
  undefined8 local_1d88;
  undefined8 local_1d80;
  undefined8 local_1d78;
  undefined8 local_1d70;
  EDCircles local_1d68;
  Mat local_1a78 [96];
  undefined1 local_1a18 [192];
  EDCircles local_1958;
  Mat local_1668 [96];
  undefined1 local_1608 [192];
  EDLines local_1548;
  string local_12a8 [96];
  Mat local_1248 [96];
  Mat local_11e8 [96];
  undefined1 local_1188 [8];
  void *pvStack_1180;
  Size local_1178;
  uchar *local_1128;
  uchar *puStack_1120;
  uchar *local_1118;
  uchar *puStack_1110;
  uchar *local_1108;
  uchar *puStack_1100;
  uchar *local_10f8;
  short *psStack_10f0;
  Mat local_10e8 [96];
  undefined8 local_1088 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  vStack_1048;
  undefined1 local_1028 [96];
  undefined1 local_fc8 [96];
  EDLines local_f68;
  Mat local_cc8 [96];
  EDPF local_c68;
  ED local_a18;
  Mat local_7f0 [96];
  Mat local_790 [96];
  EDColor local_730;
  EDColor local_5d8;
  ED local_480;
  ED local_258;
  
  if (argc < 2) {
    pcVar20 = "billiard.jpg";
  }
  else {
    pcVar20 = argv[1];
  }
  cv::Mat::Mat(local_1248);
  cv::Mat::Mat((Mat *)(local_1a18 + 0x60));
  cv::Mat::Mat((Mat *)(local_1608 + 0x60));
  std::__cxx11::string::string((string *)&local_1958,pcVar20,(allocator *)&local_1d68);
  cv::imread(local_12a8,(int)&local_1958);
  if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
       *)local_1958.super_EDPF.super_ED._0_8_ != &local_1958.super_EDPF.super_ED.segmentPoints) {
    operator_delete((void *)local_1958.super_EDPF.super_ED._0_8_);
  }
  local_1958.super_EDPF.super_ED.segmentPoints.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1958.super_EDPF.super_ED.width = 0x1010000;
  local_1958.super_EDPF.super_ED.srcImg = (uchar *)local_12a8;
  local_1d68.super_EDPF.super_ED.segmentPoints.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d68.super_EDPF.super_ED.width = 0x2010000;
  local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1248;
  cv::cvtColor((cv *)&local_1958,(_InputArray *)&local_1d68,(_OutputArray *)0x6,0,in_R8D);
  cv::ximgproc::createEdgeDrawing();
  local_1ec8.center.x = 0.0;
  local_1ec8.center.y = 0.0;
  local_1ec8.r = 0.0;
  local_1ed8 = 0;
  local_1ee8 = (void *)0x0;
  pvStack_1ee0 = (void *)0x0;
  local_1dc0 = &local_258.gradImage;
  local_1ea0 = &local_5d8.edgeImage;
  local_1e90 = local_10e8;
  local_1df0 = &local_5d8.edgeImg;
  local_1e50 = local_1088;
  local_1ea8 = &local_730.edgeImage;
  local_1df8 = &local_730.edgeImg;
  local_1dd8 = &local_480.gradImage;
  local_1e00 = &local_c68.super_ED.gradImage;
  local_1e60 = &local_a18.gradImage;
  local_1dc8 = &local_258.edgeImage;
  local_1de0 = &local_480.edgeImage;
  local_1e48 = &local_5d8.segments;
  local_1e98 = &vStack_1048;
  local_1e58 = &local_730.segments;
  local_1e08 = &local_c68.super_ED.edgeImage;
  local_1e70 = &local_a18.edgeImage;
  local_1dd0 = &local_258.srcImage;
  local_1de8 = &local_480.srcImage;
  local_1e10 = &local_c68.super_ED.srcImage;
  local_1e68 = &local_a18.srcImage;
  local_1f8c = 0;
  lVar17 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n#################################################",0x32);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n####### ( ",0xb);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_1f8c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14," ) ORIGINAL & OPENCV COMPARISON ######",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n#################################################\n",0x33);
    *(undefined8 *)((long)local_1fa0 + 0xc) = 0x2400000001;
    *(undefined4 *)((long)local_1fa0 + 0x14) = 8;
    *(undefined4 *)(local_1fa0 + 4) = 0x3f800000;
    lVar15 = cv::getTickCount();
    cv::Mat::Mat(local_cc8,local_1248);
    ED::ED(&local_a18,local_cc8,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
    cv::Mat::~Mat(local_cc8);
    lVar16 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testED.getEdgeImage()  (Original)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar16 = lVar16 - lVar15;
    if (lVar15 == 0) {
      lVar16 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)(lVar16 + lVar17) / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    lVar16 = cv::getTickCount();
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x1010000;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)local_1248;
    (**(code **)(*local_1fa0 + 0x40))(local_1fa0,&local_1958);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    ED::getAnchorImage((ED *)local_fc8);
    ED::getGradImage((ED *)local_1028);
    local_1958.super_EDPF.super_ED._0_8_ = &local_1958.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1958,"GradImage.png","");
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = local_1028;
    local_f68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f68.super_ED._0_8_ = (void *)0x0;
    local_f68.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1958,(_InputArray *)&local_1d68,(vector *)&local_f68);
    if ((void *)local_f68.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_f68.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1958.super_EDPF.super_ED._0_8_ != &local_1958.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1958.super_EDPF.super_ED._0_8_);
    }
    local_1958.super_EDPF.super_ED._0_8_ = &local_1958.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1958,"AnchorImage.png","");
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = local_fc8;
    local_f68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f68.super_ED._0_8_ = (void *)0x0;
    local_f68.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1958,(_InputArray *)&local_1d68,(vector *)&local_f68);
    if ((void *)local_f68.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_f68.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1958.super_EDPF.super_ED._0_8_ != &local_1958.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1958.super_EDPF.super_ED._0_8_);
    }
    cv::Mat::Mat(local_11e8);
    cv::Mat::Mat(local_1a78);
    ED::getEdgeImage((ED *)local_1608);
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x2010000;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)local_11e8;
    (**(code **)(*local_1fa0 + 0x48))(local_1fa0,&local_1958);
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x1010000;
    local_1958.super_EDPF.super_ED.srcImg = local_1608;
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_f68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f68.super_ED.width = 0x2010000;
    local_f68.super_ED.srcImg = (uchar *)local_1a78;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_11e8;
    cv::absdiff((_InputArray *)&local_1958,(_InputArray *)&local_1d68,(_OutputArray *)&local_f68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different pixel count              : ",0x25);
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x1010000;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)local_1a78;
    iVar12 = cv::countNonZero((_InputArray *)&local_1958);
    plVar18 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    local_1958.super_EDPF.super_ED._0_8_ = &local_1958.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1958,"EdgeImage.png","");
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_11e8;
    local_f68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f68.super_ED._0_8_ = (void *)0x0;
    local_f68.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1958,(_InputArray *)&local_1d68,(vector *)&local_f68);
    if ((void *)local_f68.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_f68.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1958.super_EDPF.super_ED._0_8_ != &local_1958.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1958.super_EDPF.super_ED._0_8_);
    }
    lVar17 = cv::getTickCount();
    ED::ED(&local_258,&local_a18);
    EDLines::EDLines(&local_f68,&local_258,1.0,-1,6.0,1.3);
    cv::Mat::~Mat(local_1dc0);
    cv::Mat::~Mat(local_1dc8);
    if (local_258.edgePoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.edgePoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_258.anchorPoints.
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.anchorPoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(local_1dd0);
    cv::Mat::~Mat(&local_258.smoothImage);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(&local_258.segmentPoints);
    lVar16 = cv::getTickCount();
    lVar16 = lVar16 - lVar17;
    if (lVar17 == 0) {
      lVar16 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testEDLines.getLineImage()         : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    poVar14 = std::ostream::_M_insert<double>(((double)lVar16 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    EDLines::getLineImage((EDLines *)local_1a18);
    lVar16 = cv::getTickCount();
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = -0x7dfcffe3;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)&local_1ee8;
    (**(code **)(*local_1fa0 + 0x60))(local_1fa0,&local_1958);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectLines()            (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    local_1958.super_EDPF.super_ED.width = 0;
    local_1958.super_EDPF.super_ED.height = 0x406fe000;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)0x0;
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pEVar21 = &local_1958;
    cv::Mat::Mat(local_1668,local_1a18._8_4_,local_1a18._12_4_,0,(Scalar_ *)pEVar21);
    iVar12 = (int)pEVar21;
    if (pvStack_1ee0 != local_1ee8) {
      lVar17 = 0xc;
      uVar22 = 0;
      do {
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.width = 0x3010000;
        local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1668;
        local_1e18 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -0xc));
        local_1e14 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -8));
        local_1e20 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -4));
        local_1e1c = (int)ROUND(*(float *)((long)local_1ee8 + lVar17));
        local_1958.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1958.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1958.super_EDPF.super_ED.width = 0;
        local_1958.super_EDPF.super_ED.height = 0;
        local_1958.super_EDPF.super_ED.srcImg = (uchar *)0x0;
        iVar12 = 1;
        cv::line(&local_1d68,&local_1e18,&local_1e20,&local_1958,1,0x10,0);
        uVar22 = uVar22 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar22 < (ulong)((long)pvStack_1ee0 - (long)local_1ee8 >> 4));
    }
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x1010000;
    local_1958.super_EDPF.super_ED.srcImg = local_1a18;
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1668;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x2010000;
    local_1548.super_ED.srcImg = (uchar *)local_1a78;
    cv::absdiff((_InputArray *)&local_1958,(_InputArray *)&local_1d68,(_OutputArray *)&local_1548);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different pixel count              : ",0x25);
    local_1958.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1958.super_EDPF.super_ED.width = 0x1010000;
    local_1958.super_EDPF.super_ED.srcImg = (uchar *)local_1a78;
    iVar13 = cv::countNonZero((_InputArray *)&local_1958);
    plVar18 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    local_1958.super_EDPF.super_ED._0_8_ = &local_1958.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1958,"LinesImage.png","");
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1668;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED._0_8_ = (void *)0x0;
    local_1548.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1958,(_InputArray *)&local_1d68,(vector *)&local_1548);
    if ((void *)local_1548.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_1548.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1958.super_EDPF.super_ED._0_8_ != &local_1958.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1958.super_EDPF.super_ED._0_8_);
    }
    lVar17 = cv::getTickCount();
    ED::ED(&local_480,&local_f68.super_ED);
    EDCircles::EDCircles(&local_1958,&local_480);
    cv::Mat::~Mat(local_1dd8);
    cv::Mat::~Mat(local_1de0);
    if (local_480.edgePoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_480.edgePoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_480.anchorPoints.
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_480.anchorPoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(local_1de8);
    cv::Mat::~Mat(&local_480.smoothImage);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(&local_480.segmentPoints);
    lVar16 = cv::getTickCount();
    lVar16 = lVar16 - lVar17;
    if (lVar17 == 0) {
      lVar16 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"EDCircles(testEDLines)             : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    poVar14 = std::ostream::_M_insert<double>(((double)lVar16 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    lVar16 = cv::getTickCount();
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = -0x7dfcffd2;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)&local_1ec8;
    (**(code **)(*local_1fa0 + 0x68))(local_1fa0,&local_1d68);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    EDCircles::getCircles(&local_1f68,&local_1958);
    EDCircles::getEllipses(&local_1f88,&local_1958);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x2010000;
    local_1548.super_ED.srcImg = local_1a18 + 0x60;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1248;
    cv::cvtColor((cv *)&local_1d68,(_InputArray *)&local_1548,(_OutputArray *)0x8,0,iVar12);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x2010000;
    local_1548.super_ED.srcImg = local_1608 + 0x60;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1248;
    cv::cvtColor((cv *)&local_1d68,(_InputArray *)&local_1548,(_OutputArray *)0x8,0,iVar12);
    if (local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar17 = 0x10;
      uVar22 = 0;
      do {
        local_1e28 = (int)*(double *)
                           ((long)&((local_1f68.
                                     super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                                     super__Vector_impl_data._M_start)->center).x + lVar17);
        pdVar1 = (double *)
                 ((long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17 + -0x10);
        local_1d68.super_EDPF.super_ED.width = 0;
        local_1d68.super_EDPF.super_ED.height = 0;
        local_1d68.super_EDPF.super_ED.srcImg = (uchar *)0x406fe00000000000;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1548.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1548.super_ED.width = 0x3010000;
        local_1548.super_ED.srcImg = local_1a18 + 0x60;
        local_1d70 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        local_1e24 = local_1e28;
        cv::ellipse(0,0,0,&local_1548,&local_1d70,&local_1e28,&local_1d68,1,0x10,0);
        uVar22 = uVar22 + 1;
        uVar19 = ((long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar17 = lVar17 + 0x18;
      } while (uVar22 <= uVar19 && uVar19 - uVar22 != 0);
    }
    if (local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar17 = 0x18;
      uVar22 = 0;
      do {
        pdVar1 = (double *)
                 ((long)local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar17 + -0x18);
        local_1d80 = *(undefined8 *)
                      ((long)local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
        local_1d68.super_EDPF.super_ED.width = 0;
        local_1d68.super_EDPF.super_ED.height = 0x406fe000;
        local_1d68.super_EDPF.super_ED.srcImg = (uchar *)0x406fe00000000000;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1548.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1548.super_ED.width = 0x3010000;
        local_1548.super_ED.srcImg = local_1a18 + 0x60;
        local_1d78 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        cv::ellipse(SUB84((*(double *)
                            ((long)&((local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->center).x + lVar17)
                          * 180.0) / 3.141592653589793,0),0,0,&local_1548,&local_1d78,&local_1d80,
                    &local_1d68,1,0x10,0);
        uVar22 = uVar22 + 1;
        lVar17 = lVar17 + 0x20;
      } while (uVar22 < (ulong)((long)local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_1ec8.center.y != local_1ec8.center.x) {
      lVar17 = 0x28;
      uVar22 = 0;
      do {
        dVar3 = *(double *)((long)local_1ec8.center.x + lVar17 + -0x18);
        iVar12 = (int)dVar3;
        pdVar1 = (double *)((long)local_1ec8.center.x + lVar17 + -0x28);
        pdVar2 = (double *)((long)local_1ec8.center.x + lVar17 + -0x10);
        local_1d68.super_EDPF.super_ED._0_8_ = -(ulong)(dVar3 == 0.0) & 0x406fe00000000000;
        local_1d90 = CONCAT44(iVar12 + (int)pdVar2[1],iVar12 + (int)*pdVar2);
        local_1d68.super_EDPF.super_ED.srcImg = (uchar *)0x406fe00000000000;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1548.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1548.super_ED.width = 0x3010000;
        local_1548.super_ED.srcImg = local_1608 + 0x60;
        local_1d88 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        cv::ellipse((int)*(undefined8 *)((long)local_1ec8.center.x + lVar17),0,0,&local_1548,
                    &local_1d88,&local_1d90,&local_1d68,1,0x10,0);
        uVar22 = uVar22 + 1;
        lVar17 = lVar17 + 0x30;
      } while (uVar22 < (ulong)(((long)local_1ec8.center.y - (long)local_1ec8.center.x >> 4) *
                               -0x5555555555555555));
    }
    local_1d68.super_EDPF.super_ED._0_8_ = &local_1d68.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d68,"EllipsImage-Original.png","");
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1548.super_ED.srcImg = local_1a18 + 0x60;
    local_c68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c68.super_ED._0_8_ = (void *)0x0;
    local_c68.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1d68,(_InputArray *)&local_1548,(vector *)&local_c68);
    if ((void *)local_c68.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_c68.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1d68.super_EDPF.super_ED._0_8_ != &local_1d68.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1d68.super_EDPF.super_ED._0_8_);
    }
    local_1d68.super_EDPF.super_ED._0_8_ = &local_1d68.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d68,"EllipsImage-OpenCV.png","");
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1548.super_ED.srcImg = local_1608 + 0x60;
    local_c68.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c68.super_ED._0_8_ = (void *)0x0;
    local_c68.super_ED.srcImg = (uchar *)0x0;
    cv::imwrite((string *)&local_1d68,(_InputArray *)&local_1548,(vector *)&local_c68);
    if ((void *)local_c68.super_ED._0_8_ != (void *)0x0) {
      operator_delete((void *)local_c68.super_ED._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1d68.super_EDPF.super_ED._0_8_ != &local_1d68.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1d68.super_EDPF.super_ED._0_8_);
    }
    lVar16 = cv::getTickCount();
    cv::Mat::Mat(local_790,local_1248);
    EDPF::EDPF(&local_c68,local_790);
    cv::Mat::~Mat(local_790);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testEDPF.getEdgeImage()            : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    *(undefined8 *)((long)local_1fa0 + 0xc) = 0xb00000000;
    *(undefined4 *)((long)local_1fa0 + 0x14) = 3;
    *(undefined1 *)(local_1fa0 + 1) = 1;
    lVar16 = cv::getTickCount();
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1248;
    (**(code **)(*local_1fa0 + 0x40))(local_1fa0,&local_1d68);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectEdges()  PF        (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    ED::getEdgeImage((ED *)&local_1d68);
    cv::Mat::operator=((Mat *)local_1608,(Mat *)&local_1d68);
    cv::Mat::~Mat((Mat *)&local_1d68);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x2010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_11e8;
    (**(code **)(*local_1fa0 + 0x48))(local_1fa0,&local_1d68);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = local_1608;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1178.width = 0;
    local_1178.height = 0;
    local_1188._0_4_ = 0x2010000;
    pvStack_1180 = local_1a78;
    local_1548.super_ED.srcImg = (uchar *)local_11e8;
    cv::absdiff((_InputArray *)&local_1d68,(_InputArray *)&local_1548,(_OutputArray *)local_1188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different pixel count              : ",0x25);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1a78;
    iVar12 = cv::countNonZero((_InputArray *)&local_1d68);
    plVar18 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    local_1d68.super_EDPF.super_ED._0_8_ = &local_1d68.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d68,"EdgeImage-PF.png","");
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1548.super_ED.srcImg = (uchar *)local_11e8;
    local_1178.width = 0;
    local_1178.height = 0;
    local_1188 = (undefined1  [8])0x0;
    pvStack_1180 = (void *)0x0;
    cv::imwrite((string *)&local_1d68,(_InputArray *)&local_1548,(vector *)local_1188);
    if (local_1188 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1188);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1d68.super_EDPF.super_ED._0_8_ != &local_1d68.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1d68.super_EDPF.super_ED._0_8_);
    }
    lVar16 = cv::getTickCount();
    cv::Mat::Mat(local_7f0,(Mat *)local_12a8);
    EDColor::EDColor((EDColor *)local_1188,local_7f0,0x24,4,1.5,false);
    cv::Mat::~Mat(local_7f0);
    EDColor::getEdgeImage((EDColor *)&local_1d68);
    cv::Mat::operator=((Mat *)local_1608,(Mat *)&local_1d68);
    cv::Mat::~Mat((Mat *)&local_1d68);
    lVar17 = cv::getTickCount();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"testEDColor.getEdgeImage()         : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    *(undefined8 *)((long)local_1fa0 + 0xc) = 0x2400000000;
    *(undefined4 *)((long)local_1fa0 + 0x14) = 4;
    *(undefined4 *)(local_1fa0 + 4) = 0x3fc00000;
    *(undefined1 *)(local_1fa0 + 1) = 0;
    lVar16 = cv::getTickCount();
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_12a8;
    (**(code **)(*local_1fa0 + 0x40))(local_1fa0,&local_1d68);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectEdges()            (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x2010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_11e8;
    (**(code **)(*local_1fa0 + 0x48))(local_1fa0,&local_1d68);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = local_1608;
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1f38.width = 0;
    local_1f38.height = 0;
    local_1f48 = (pointer)CONCAT44(local_1f48._4_4_,0x2010000);
    pmStack_1f40 = (pointer)local_1a78;
    local_1548.super_ED.srcImg = (uchar *)local_11e8;
    cv::absdiff((_InputArray *)&local_1d68,(_InputArray *)&local_1548,(_OutputArray *)&local_1f48);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different pixel count              : ",0x25);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1a78;
    iVar12 = cv::countNonZero((_InputArray *)&local_1d68);
    plVar18 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    local_1d68.super_EDPF.super_ED._0_8_ = &local_1d68.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d68,"EdgeImage-Color.png","");
    local_1548.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1548.super_ED.width = 0x1010000;
    local_1548.super_ED.srcImg = local_1608;
    local_1f38.width = 0;
    local_1f38.height = 0;
    local_1f48 = (pointer)0x0;
    pmStack_1f40 = (pointer)0x0;
    cv::imwrite((string *)&local_1d68,(_InputArray *)&local_1548,(vector *)&local_1f48);
    if (local_1f48 != (pointer)0x0) {
      operator_delete(local_1f48);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1d68.super_EDPF.super_ED._0_8_ != &local_1d68.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1d68.super_EDPF.super_ED._0_8_);
    }
    lVar16 = cv::getTickCount();
    cv::Mat::Mat(&local_5d8.inputImage,(Mat *)local_1188);
    local_5d8.dirImg = local_10f8;
    local_5d8.gradImg = psStack_10f0;
    local_5d8.smooth_a = local_1108;
    local_5d8.smooth_b = puStack_1100;
    local_5d8.b_Img = local_1118;
    local_5d8.smooth_L = puStack_1110;
    local_5d8.L_Img = local_1128;
    local_5d8.a_Img = puStack_1120;
    cv::Mat::Mat(local_1ea0,local_1e90);
    puVar4 = (uchar *)*local_1e50;
    puVar5 = (uchar *)local_1e50[1];
    puVar6 = (uchar *)local_1e50[2];
    puVar7 = (uchar *)local_1e50[3];
    uVar8 = local_1e50[4];
    dVar3 = (double)local_1e50[5];
    uVar9 = local_1e50[7];
    local_1df0[6] = (uchar *)local_1e50[6];
    local_1df0[7] = (uchar *)uVar9;
    local_1df0[4] = (uchar *)uVar8;
    local_1df0[5] = (uchar *)dVar3;
    local_1df0[2] = puVar6;
    local_1df0[3] = puVar7;
    *local_1df0 = puVar4;
    local_1df0[1] = puVar5;
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::vector(local_1e48,local_1e98);
    EDLines::EDLines(&local_1548,&local_5d8,1.0,-1,6.0,1.3);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(local_1e48);
    cv::Mat::~Mat(local_1ea0);
    cv::Mat::~Mat(&local_5d8.inputImage);
    lVar17 = cv::getTickCount();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"get lines from color image         : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    EDLines::getLineImage((EDLines *)&local_1d68);
    cv::Mat::operator=((Mat *)local_1a18,(Mat *)&local_1d68);
    cv::Mat::~Mat((Mat *)&local_1d68);
    local_1d68.super_EDPF.super_ED._0_8_ = &local_1d68.super_EDPF.super_ED.segmentPoints;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d68,"LinesImage-Color.png","")
    ;
    local_1f38.width = 0;
    local_1f38.height = 0;
    local_1f48 = (pointer)CONCAT44(local_1f48._4_4_,0x1010000);
    pmStack_1f40 = (pointer)local_1a18;
    local_1fb8.sz.width = 0;
    local_1fb8.sz.height = 0;
    local_1fb8._0_8_ = (void *)0x0;
    local_1fb8.obj = (void *)0x0;
    cv::imwrite((string *)&local_1d68,(_InputArray *)&local_1f48,(vector *)&local_1fb8);
    if ((void *)local_1fb8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_1fb8._0_8_);
    }
    if ((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
         *)local_1d68.super_EDPF.super_ED._0_8_ != &local_1d68.super_EDPF.super_ED.segmentPoints) {
      operator_delete((void *)local_1d68.super_EDPF.super_ED._0_8_);
    }
    lVar16 = cv::getTickCount();
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = -0x7dfcffe3;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)&local_1ee8;
    (**(code **)(*local_1fa0 + 0x60))(local_1fa0,&local_1d68);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectLines()            (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    local_1f48 = (pointer)0x406fe00000000000;
    pmStack_1f40 = (pointer)0x0;
    local_1f38.width = 0;
    local_1f38.height = 0;
    uStack_1f30 = 0;
    cv::Mat::Mat((Mat *)&local_1d68,local_1a18._8_4_,local_1a18._12_4_,0,(Scalar_ *)&local_1f48);
    cv::Mat::operator=(local_1668,(Mat *)&local_1d68);
    cv::Mat::~Mat((Mat *)&local_1d68);
    if (pvStack_1ee0 != local_1ee8) {
      lVar17 = 0xc;
      uVar22 = 0;
      do {
        local_1f38.width = 0;
        local_1f38.height = 0;
        local_1f48 = (pointer)CONCAT44(local_1f48._4_4_,0x3010000);
        pmStack_1f40 = (pointer)local_1668;
        local_1e30 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -0xc));
        local_1e2c = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -8));
        local_1e38 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17 + -4));
        local_1e34 = (int)ROUND(*(float *)((long)local_1ee8 + lVar17));
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.segmentPoints.
        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1d68.super_EDPF.super_ED.width = 0;
        local_1d68.super_EDPF.super_ED.height = 0;
        local_1d68.super_EDPF.super_ED.srcImg = (uchar *)0x0;
        cv::line((_InputArray *)&local_1f48,&local_1e30,&local_1e38,&local_1d68,1,0x10,0);
        uVar22 = uVar22 + 1;
        lVar17 = lVar17 + 0x10;
      } while (uVar22 < (ulong)((long)pvStack_1ee0 - (long)local_1ee8 >> 4));
    }
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = local_1a18;
    local_1f38.width = 0;
    local_1f38.height = 0;
    local_1f48._0_4_ = 0x1010000;
    pmStack_1f40 = (pointer)local_1668;
    local_1fb8.sz.width = 0;
    local_1fb8.sz.height = 0;
    local_1fb8.flags = 0x2010000;
    local_1fb8.obj = local_1a78;
    cv::absdiff((_InputArray *)&local_1d68,(_InputArray *)&local_1f48,(_OutputArray *)&local_1fb8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"different pixel count              : ",0x25);
    local_1d68.super_EDPF.super_ED.segmentPoints.
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d68.super_EDPF.super_ED.width = 0x1010000;
    local_1d68.super_EDPF.super_ED.srcImg = (uchar *)local_1a78;
    iVar12 = cv::countNonZero((_InputArray *)&local_1d68);
    plVar18 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar12);
    std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
    std::ostream::put((char)plVar18);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-------------------------------------------------\n",0x32);
    lVar16 = cv::getTickCount();
    cv::Mat::Mat(&local_730.inputImage,(Mat *)local_1188);
    local_730.dirImg = local_10f8;
    local_730.gradImg = psStack_10f0;
    local_730.smooth_a = local_1108;
    local_730.smooth_b = puStack_1100;
    local_730.b_Img = local_1118;
    local_730.smooth_L = puStack_1110;
    local_730.L_Img = local_1128;
    local_730.a_Img = puStack_1120;
    cv::Mat::Mat(local_1ea8,local_1e90);
    puVar4 = (uchar *)*local_1e50;
    puVar5 = (uchar *)local_1e50[1];
    puVar6 = (uchar *)local_1e50[2];
    puVar7 = (uchar *)local_1e50[3];
    uVar8 = local_1e50[4];
    dVar3 = (double)local_1e50[5];
    uVar9 = local_1e50[7];
    local_1df8[6] = (uchar *)local_1e50[6];
    local_1df8[7] = (uchar *)uVar9;
    local_1df8[4] = (uchar *)uVar8;
    local_1df8[5] = (uchar *)dVar3;
    local_1df8[2] = puVar6;
    local_1df8[3] = puVar7;
    *local_1df8 = puVar4;
    local_1df8[1] = puVar5;
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::vector(local_1e58,local_1e98);
    EDCircles::EDCircles(&local_1d68,&local_730);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(local_1e58);
    cv::Mat::~Mat(local_1ea8);
    cv::Mat::~Mat(&local_730.inputImage);
    lVar17 = cv::getTickCount();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"get circles from color image       : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    lVar16 = cv::getTickCount();
    local_1f38.width = 0;
    local_1f38.height = 0;
    local_1f48 = (pointer)CONCAT44(local_1f48._4_4_,0x8203002e);
    pmStack_1f40 = (pointer)&local_1ec8;
    (**(code **)(*local_1fa0 + 0x68))(local_1fa0,(_InputArray *)&local_1f48);
    lVar17 = cv::getTickCount();
    lVar17 = lVar17 - lVar16;
    if (lVar16 == 0) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"detectEllipses()         (OpenCV)  : ",0x25);
    dVar3 = (double)cv::getTickFrequency();
    poVar14 = std::ostream::_M_insert<double>(((double)lVar17 / dVar3) * 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," ms.",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    EDCircles::getCircles((vector<mCircle,_std::allocator<mCircle>_> *)&local_1f48,&local_1d68);
    pmVar11 = local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)local_1f48;
    local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)pmStack_1f40;
    local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)local_1f38;
    local_1f48 = (pointer)0x0;
    pmStack_1f40 = (pointer)0x0;
    local_1f38.width = 0;
    local_1f38.height = 0;
    if (pmVar11 != (mCircle *)0x0) {
      operator_delete(pmVar11);
      if (local_1f48 != (pointer)0x0) {
        operator_delete(local_1f48);
      }
    }
    EDCircles::getEllipses((vector<mEllipse,_std::allocator<mEllipse>_> *)&local_1f48,&local_1d68);
    pmVar10 = local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
    super__Vector_impl_data._M_start = local_1f48;
    local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
    super__Vector_impl_data._M_finish = pmStack_1f40;
    local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1f38;
    local_1f48 = (pointer)0x0;
    pmStack_1f40 = (pointer)0x0;
    local_1f38.width = 0;
    local_1f38.height = 0;
    if (pmVar10 != (pointer)0x0) {
      operator_delete(pmVar10);
      if (local_1f48 != (pointer)0x0) {
        operator_delete(local_1f48);
      }
    }
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)(local_1a18 + 0x60),(Mat *)&local_1f48);
    cv::Mat::~Mat((Mat *)&local_1f48);
    cv::Mat::clone();
    cv::Mat::operator=((Mat *)(local_1608 + 0x60),(Mat *)&local_1f48);
    cv::Mat::~Mat((Mat *)&local_1f48);
    if (local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar16 = 0x10;
      uVar22 = 0;
      do {
        local_1e40 = (int)*(double *)
                           ((long)&((local_1f68.
                                     super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                                     super__Vector_impl_data._M_start)->center).x + lVar16);
        pdVar1 = (double *)
                 ((long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16 + -0x10);
        local_1f48 = (pointer)0x0;
        pmStack_1f40 = (pointer)0x406fe00000000000;
        local_1f38.width = 0;
        local_1f38.height = 0;
        uStack_1f30 = 0;
        local_1fb8.sz.width = 0;
        local_1fb8.sz.height = 0;
        local_1fb8.flags = 0x3010000;
        local_1fb8.obj = local_1a18 + 0x60;
        local_1d98 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        local_1e3c = local_1e40;
        cv::ellipse(0,0,0,&local_1fb8,&local_1d98,&local_1e40,(_InputArray *)&local_1f48,2,0x10,0);
        uVar22 = uVar22 + 1;
        uVar19 = ((long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        lVar16 = lVar16 + 0x18;
      } while (uVar22 <= uVar19 && uVar19 - uVar22 != 0);
    }
    if (local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar16 = 0x18;
      uVar22 = 0;
      do {
        pdVar1 = (double *)
                 ((long)local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16 + -0x18);
        local_1da8 = *(undefined8 *)
                      ((long)local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
        local_1f48 = (pointer)0x406fe00000000000;
        pmStack_1f40 = (pointer)0x406fe00000000000;
        local_1f38.width = 0;
        local_1f38.height = 0;
        uStack_1f30 = 0;
        local_1fb8.sz.width = 0;
        local_1fb8.sz.height = 0;
        local_1fb8.flags = 0x3010000;
        local_1fb8.obj = local_1a18 + 0x60;
        local_1da0 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        cv::ellipse(SUB84((*(double *)
                            ((long)&((local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->center).x + lVar16)
                          * 180.0) / 3.141592653589793,0),0,0,&local_1fb8,&local_1da0,&local_1da8,
                    (_InputArray *)&local_1f48,2,0x10,0);
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0x20;
      } while (uVar22 < (ulong)((long)local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1f88.
                                      super__Vector_base<mEllipse,_std::allocator<mEllipse>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_1ec8.center.y != local_1ec8.center.x) {
      lVar16 = 0x28;
      uVar22 = 0;
      do {
        dVar3 = *(double *)((long)local_1ec8.center.x + lVar16 + -0x18);
        iVar12 = (int)dVar3;
        pdVar1 = (double *)((long)local_1ec8.center.x + lVar16 + -0x28);
        pdVar2 = (double *)((long)local_1ec8.center.x + lVar16 + -0x10);
        local_1f48 = (pointer)(-(ulong)(dVar3 == 0.0) & 0x406fe00000000000);
        local_1db8 = CONCAT44(iVar12 + (int)pdVar2[1],iVar12 + (int)*pdVar2);
        pmStack_1f40 = (pointer)0x406fe00000000000;
        local_1f38.width = 0;
        local_1f38.height = 0;
        uStack_1f30 = 0;
        local_1fb8.sz.width = 0;
        local_1fb8.sz.height = 0;
        local_1fb8.flags = 0x3010000;
        local_1fb8.obj = local_1608 + 0x60;
        local_1db0 = CONCAT44((int)pdVar1[1],(int)*pdVar1);
        cv::ellipse((int)*(undefined8 *)((long)local_1ec8.center.x + lVar16),0,0,&local_1fb8,
                    &local_1db0,&local_1db8,(_InputArray *)&local_1f48,2,0x10,0);
        uVar22 = uVar22 + 1;
        lVar16 = lVar16 + 0x30;
      } while (uVar22 < (ulong)(((long)local_1ec8.center.y - (long)local_1ec8.center.x >> 4) *
                               -0x5555555555555555));
    }
    local_1f48 = (pointer)&local_1f38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f48,"EllipsImageColor-Original.png","");
    local_1fb8.sz.width = 0;
    local_1fb8.sz.height = 0;
    local_1fb8.flags = 0x1010000;
    local_1fb8.obj = local_1a18 + 0x60;
    local_1e78 = 0;
    local_1e88 = (void *)0x0;
    uStack_1e80 = 0;
    cv::imwrite((string *)&local_1f48,&local_1fb8,(vector *)&local_1e88);
    if (local_1e88 != (void *)0x0) {
      operator_delete(local_1e88);
    }
    if (local_1f48 != (pointer)&local_1f38) {
      operator_delete(local_1f48);
    }
    local_1f48 = (pointer)&local_1f38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f48,"EllipsImageColor-OpenCV.png","");
    local_1fb8.sz.width = 0;
    local_1fb8.sz.height = 0;
    local_1fb8.flags = 0x1010000;
    local_1fb8.obj = local_1608 + 0x60;
    local_1e78 = 0;
    local_1e88 = (void *)0x0;
    uStack_1e80 = 0;
    cv::imwrite((string *)&local_1f48,&local_1fb8,(vector *)&local_1e88);
    if (local_1e88 != (void *)0x0) {
      operator_delete(local_1e88);
    }
    if (local_1f48 != (pointer)&local_1f38) {
      operator_delete(local_1f48);
    }
    EDCircles::~EDCircles(&local_1d68);
    EDLines::~EDLines(&local_1548);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(local_1e98);
    cv::Mat::~Mat(local_1e90);
    cv::Mat::~Mat((Mat *)local_1188);
    cv::Mat::~Mat(local_1e00);
    cv::Mat::~Mat(local_1e08);
    if (local_c68.super_ED.edgePoints.
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c68.super_ED.edgePoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_c68.super_ED.anchorPoints.
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c68.super_ED.anchorPoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(local_1e10);
    cv::Mat::~Mat((Mat *)((long)&local_c68 + 0x30));
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)((long)&local_c68 + 0x10));
    if (local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f88.super__Vector_base<mEllipse,_std::allocator<mEllipse>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
        super__Vector_impl_data._M_start != (mCircle *)0x0) {
      operator_delete(local_1f68.super__Vector_base<mCircle,_std::allocator<mCircle>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    EDCircles::~EDCircles(&local_1958);
    cv::Mat::~Mat(local_1668);
    cv::Mat::~Mat((Mat *)local_1a18);
    EDLines::~EDLines(&local_f68);
    cv::Mat::~Mat((Mat *)local_1608);
    cv::Mat::~Mat(local_1a78);
    cv::Mat::~Mat(local_11e8);
    cv::Mat::~Mat((Mat *)local_1028);
    cv::Mat::~Mat((Mat *)local_fc8);
    cv::Mat::~Mat(local_1e60);
    cv::Mat::~Mat(local_1e70);
    if (local_a18.edgePoints.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a18.edgePoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (local_a18.anchorPoints.
        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a18.anchorPoints.
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(local_1e68);
    cv::Mat::~Mat(&local_a18.smoothImage);
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::~vector(&local_a18.segmentPoints);
    local_1f8c = local_1f8c + 1;
  } while (local_1f8c != 3);
  if (local_1ee8 != (void *)0x0) {
    operator_delete(local_1ee8);
  }
  if ((void *)local_1ec8.center.x != (void *)0x0) {
    operator_delete((void *)local_1ec8.center.x);
  }
  if (local_1f98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f98);
  }
  cv::Mat::~Mat((Mat *)local_12a8);
  cv::Mat::~Mat((Mat *)(local_1608 + 0x60));
  cv::Mat::~Mat((Mat *)(local_1a18 + 0x60));
  cv::Mat::~Mat(local_1248);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    char* filename;
    if (argc > 1)
        filename = argv[1];
    else
        filename = "billiard.jpg";

    Mat testImg, ellipsImg0, ellipsImg1;
    Mat colorImg = imread(filename);
    cvtColor(colorImg, testImg, COLOR_BGR2GRAY);

    Ptr<EdgeDrawing> ed = createEdgeDrawing();
    vector<Vec6d> ellipses;
    vector<Vec4f> lines;

    TickMeter tm;
    for (int i = 0; i < 3; i++)
    {
        cout << "\n#################################################";
        cout << "\n####### ( " << i << " ) ORIGINAL & OPENCV COMPARISON ######";
        cout << "\n#################################################\n";

        ed->params.EdgeDetectionOperator = EdgeDrawing::SOBEL;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 8;
        ed->params.Sigma = 1.0;

        //Detection of edge segments from an input image    
        tm.start();
        //Call ED constructor
        ED testED = ED(testImg, SOBEL_OPERATOR, 36, 8, 1, 10, 1.0, true);
        tm.stop();
        std::cout << "testED.getEdgeImage()  (Original)  : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat anchImg = testED.getAnchorImage();
        Mat gradImg = testED.getGradImage();
        imwrite("GradImage.png", gradImg);
        imwrite("AnchorImage.png", anchImg);

        Mat edgeImg1, diff;
        Mat edgeImg0 = testED.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;

        imwrite("EdgeImage.png", edgeImg1);

        //***************************** EDLINES Line Segment Detection *****************************
        //Detection of lines segments from edge segments instead of input image
        //Therefore, redundant detection of edge segmens can be avoided
        tm.reset();
        tm.start();
        EDLines testEDLines = EDLines(testED);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDLines.getLineImage()         : " << tm.getTimeMilli() << " ms." << endl;
        Mat lineImg0 = testEDLines.getLineImage();    //draws on an empty image

        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        Mat lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("LinesImage.png", lineImg1);

        //***************************** EDCIRCLES Circle Segment Detection *****************************
        //Detection of circles from already available EDPF or ED image
        tm.reset();
        tm.start();
        EDCircles testEDCircles = EDCircles(testEDLines);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "EDCircles(testEDLines)             : " << tm.getTimeMilli() << " ms." << endl;

        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;
        cout << "-------------------------------------------------\n";

        vector<mCircle> found_circles = testEDCircles.getCircles();
        vector<mEllipse> found_ellipses = testEDCircles.getEllipses();

        cvtColor(testImg, ellipsImg0, COLOR_GRAY2BGR);
        cvtColor(testImg, ellipsImg1, COLOR_GRAY2BGR);
 
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 1, LINE_AA);
        }

        imwrite("EllipsImage-Original.png", ellipsImg0);
        imwrite("EllipsImage-OpenCV.png", ellipsImg1);

        //************************** EDPF Parameter-free Edge Segment Detection **************************
        // Detection of edge segments with parameter free ED (EDPF)
        tm.reset();
        tm.start();
        EDPF testEDPF = EDPF(testImg);
        tm.stop();
        cout << "testEDPF.getEdgeImage()            : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 11;
        ed->params.AnchorThresholdValue = 3;
        ed->params.PFmode = true;

        tm.reset();
        tm.start();
        ed->detectEdges(testImg);
        tm.stop();
        std::cout << "detectEdges()  PF        (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        edgeImg0 = testEDPF.getEdgeImage();
        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-PF.png", edgeImg1);

        //*********************** EDCOLOR Edge Segment Detection from Color Images **********************

        tm.reset();
        tm.start();
        EDColor testEDColor = EDColor(colorImg, 36);
        edgeImg0 = testEDColor.getEdgeImage();
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "testEDColor.getEdgeImage()         : " << tm.getTimeMilli() << " ms." << endl;

        ed->params.EdgeDetectionOperator = EdgeDrawing::PREWITT;
        ed->params.GradientThresholdValue = 36;
        ed->params.AnchorThresholdValue = 4;
        ed->params.Sigma = 1.5;
        ed->params.PFmode = false;
        tm.reset();
        tm.start();
        ed->detectEdges(colorImg);
        tm.stop();
        cout << "detectEdges()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        ed->getEdgeImage(edgeImg1);
        absdiff(edgeImg0, edgeImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        imwrite("EdgeImage-Color.png", edgeImg0);

        tm.reset();
        tm.start();
        // get lines from color image
        EDLines colorLine = EDLines(testEDColor);
        tm.stop();
        cout << "-------------------------------------------------\n";
        cout << "get lines from color image         : " << tm.getTimeMilli() << " ms." << endl;
        lineImg0 = colorLine.getLineImage();
        imwrite("LinesImage-Color.png", lineImg0);
        tm.reset();
        tm.start();
        ed->detectLines(lines);
        tm.stop();
        cout << "detectLines()            (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        lineImg1 = Mat(lineImg0.rows, lineImg0.cols, CV_8UC1, Scalar(255));

        for (int i = 0; i < lines.size(); i++)
            line(lineImg1, Point2d(lines[i][0], lines[i][1]), Point2d(lines[i][2], lines[i][3]), Scalar(0), 1, LINE_AA);

        absdiff(lineImg0, lineImg1, diff);
        cout << "different pixel count              : " << countNonZero(diff) << endl;
        cout << "-------------------------------------------------\n";
        tm.reset();
        tm.start();
        // get circles from color image
        EDCircles colorCircle = EDCircles(testEDColor);
        tm.stop();
        cout << "get circles from color image       : " << tm.getTimeMilli() << " ms." << endl;
        tm.reset();
        tm.start();
        ed->detectEllipses(ellipses);
        tm.stop();
        cout << "detectEllipses()         (OpenCV)  : " << tm.getTimeMilli() << " ms." << endl;

        found_circles = colorCircle.getCircles();
        found_ellipses = colorCircle.getEllipses();

        ellipsImg0 = colorImg.clone();
        ellipsImg1 = colorImg.clone();
        for (int i = 0; i < found_circles.size(); i++)
        {
            Point center((int)found_circles[i].center.x, (int)found_circles[i].center.y);
            Size axes((int)found_circles[i].r, (int)found_circles[i].r);
            double angle(0.0);
            Scalar color = Scalar(0, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (int i = 0; i < found_ellipses.size(); i++)
        {
            Point center((int)found_ellipses[i].center.x, (int)found_ellipses[i].center.y);
            Size axes((int)found_ellipses[i].axes.width, (int)found_ellipses[i].axes.height);
            double angle = found_ellipses[i].theta * 180 / CV_PI;
            Scalar color = Scalar(255, 255, 0);

            ellipse(ellipsImg0, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        for (size_t i = 0; i < ellipses.size(); i++)
        {
            Point center((int)ellipses[i][0], (int)ellipses[i][1]);
            Size axes((int)ellipses[i][2] + (int)ellipses[i][3], (int)ellipses[i][2] + (int)ellipses[i][4]);
            double angle(ellipses[i][5]);
            Scalar color = ellipses[i][2] == 0 ? Scalar(255, 255, 0) : Scalar(0, 255, 0);

            ellipse(ellipsImg1, center, axes, angle, 0, 360, color, 2, LINE_AA);
        }

        imwrite("EllipsImageColor-Original.png", ellipsImg0);
        imwrite("EllipsImageColor-OpenCV.png", ellipsImg1);
    }
    return 0;
}